

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O2

void __thiscall
mjs::gc_vector<mjs::object::property>::gc_table::
emplace_back<mjs::string_const&,mjs::value_const&,mjs::property_attribute&>
          (gc_table *this,string *args,value *args_1,property_attribute *args_2)

{
  uint uVar1;
  
  uVar1 = this->length_;
  if (uVar1 < this->capacity_) {
    this->length_ = uVar1 + 1;
    object::property::property((property *)(this + (ulong)uVar1 + 1),args,args_1,*args_2);
    return;
  }
  __assert_fail("length() < capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h",
                0x82,
                "void mjs::gc_vector<mjs::object::property>::gc_table::emplace_back(Args &&...) [T = mjs::object::property, Args = <const mjs::string &, const mjs::value &, mjs::property_attribute &>]"
               );
}

Assistant:

uint32_t length() const { return length_; }